

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O2

MPP_RET hal_h265d_vdpu382_init(void *hal,MppHalCfg *cfg)

{
  SlotHalFbcAdjCfg *pSVar1;
  MPP_RET MVar2;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  uint uVar6;
  MppBufferGroup group;
  int *piVar7;
  long lVar8;
  
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_HOR_ALIGN,hevc_hor_align);
  mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x20),SLOTS_VER_ALIGN,hevc_ver_align);
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu382_init",1000);
  *(void **)((long)hal + 0x1a0) = pvVar4;
  if (pvVar4 == (void *)0x0) {
    pcVar5 = "scaling_org alloc fail";
LAB_001e7261:
    _mpp_log_l(2,"hal_h265d_vdpu382",pcVar5,(char *)0x0);
    return MPP_ERR_MALLOC;
  }
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu382_init",0x550);
  *(void **)((long)hal + 0x198) = pvVar4;
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu382_init",0x78);
  *(void **)((long)hal + 0x208) = pvVar4;
  pvVar4 = mpp_osal_calloc("hal_h265d_vdpu382_init",0xc80);
  *(void **)((long)hal + 0x210) = pvVar4;
  if (*(long *)((long)hal + 0x198) == 0) {
    pcVar5 = "scaling_rk alloc fail";
    goto LAB_001e7261;
  }
  group = *(MppBufferGroup *)((long)hal + 0x30);
  if (group == (MppBufferGroup)0x0) {
    MVar2 = mpp_buffer_group_get
                      ((MppBufferGroup *)((long)hal + 0x30),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                       "hal_h265d_vdpu382","hal_h265d_vdpu382_init");
    if (MVar2 != MPP_OK) {
      pcVar5 = "h265d mpp_buffer_group_get failed\n";
      goto LAB_001e72ae;
    }
    group = *(MppBufferGroup *)((long)hal + 0x30);
  }
  uVar6 = (uint)(*(int *)((long)hal + 0x180) != 0) * 2 + 1;
  MVar2 = mpp_buffer_get_with_tag
                    (group,(MppBuffer *)((long)hal + 0x1c8),(ulong)(uVar6 * 0x1e000 + 0x7000),
                     "hal_h265d_vdpu382","hal_h265d_vdpu382_init");
  if (MVar2 == MPP_OK) {
    iVar3 = mpp_buffer_get_fd_with_caller
                      (*(MppBuffer *)((long)hal + 0x1c8),"hal_h265d_vdpu382_init");
    *(int *)((long)hal + 0x1d0) = iVar3;
    *(undefined4 *)((long)hal + 0x1d4) = 0;
    piVar7 = (int *)((long)hal + 0x1d8);
    iVar3 = 0xa000;
    for (lVar8 = 0; (ulong)uVar6 * 10 - lVar8 != 0; lVar8 = lVar8 + 10) {
      pvVar4 = mpp_osal_calloc("hal_h265d_vdpu382_init",700);
      *(void **)((long)hal + lVar8 * 4 + 0x128) = pvVar4;
      *piVar7 = iVar3 + -0x3000;
      piVar7[3] = iVar3 + -0x1000;
      piVar7[6] = iVar3;
      piVar7 = piVar7 + 1;
      iVar3 = iVar3 + 0x1e000;
    }
    if (*(int *)((long)hal + 0x180) == 0) {
      *(undefined8 *)((long)hal + 0x100) = *(undefined8 *)((long)hal + 0x128);
      *(undefined4 *)((long)hal + 0x1fc) = *(undefined4 *)((long)hal + 0x1d8);
      *(undefined4 *)((long)hal + 0x200) = *(undefined4 *)((long)hal + 0x1e4);
      *(undefined4 *)((long)hal + 0x204) = *(undefined4 *)((long)hal + 0x1f0);
    }
    MVar2 = mpp_buffer_write_with_caller
                      (*(MppBuffer *)((long)hal + 0x1c8),0,cabac_table,0x6b40,
                       "hal_h265d_vdpu382_init");
    if (MVar2 != MPP_OK) {
      _mpp_log_l(2,"hal_h265d_vdpu382","h265d write cabac_table data failed\n",(char *)0x0);
      return MVar2;
    }
    pSVar1 = cfg->hal_fbc_adj_cfg;
    if (pSVar1 == (SlotHalFbcAdjCfg *)0x0) {
      return MPP_OK;
    }
    pSVar1->func = vdpu382_afbc_align_calc;
    pSVar1->expand = 0x10;
    return MPP_OK;
  }
  pcVar5 = "h265d mpp_buffer_get failed\n";
LAB_001e72ae:
  _mpp_log_l(2,"hal_h265d_vdpu382",pcVar5,(char *)0x0);
  return MVar2;
}

Assistant:

static MPP_RET hal_h265d_vdpu382_init(void *hal, MppHalCfg *cfg)
{
    RK_S32 ret = 0;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;

    mpp_slots_set_prop(reg_ctx->slots, SLOTS_HOR_ALIGN, hevc_hor_align);
    mpp_slots_set_prop(reg_ctx->slots, SLOTS_VER_ALIGN, hevc_ver_align);

    reg_ctx->scaling_qm = mpp_calloc(DXVA_Qmatrix_HEVC, 1);
    if (reg_ctx->scaling_qm == NULL) {
        mpp_err("scaling_org alloc fail");
        return MPP_ERR_MALLOC;
    }

    reg_ctx->scaling_rk = mpp_calloc(scalingFactor_t, 1);
    reg_ctx->pps_buf = mpp_calloc(RK_U64, 15);
    reg_ctx->sw_rps_buf = mpp_calloc(RK_U64, 400);

    if (reg_ctx->scaling_rk == NULL) {
        mpp_err("scaling_rk alloc fail");
        return MPP_ERR_MALLOC;
    }

    if (reg_ctx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&reg_ctx->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("h265d mpp_buffer_group_get failed\n");
            return ret;
        }
    }

    {
        RK_U32 i = 0;
        RK_U32 max_cnt = reg_ctx->fast_mode ? MAX_GEN_REG : 1;

        //!< malloc buffers
        ret = mpp_buffer_get(reg_ctx->group, &reg_ctx->bufs, ALL_BUFFER_SIZE(max_cnt));
        if (ret) {
            mpp_err("h265d mpp_buffer_get failed\n");
            return ret;
        }

        reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
        reg_ctx->offset_cabac = CABAC_TAB_OFFSET;
        for (i = 0; i < max_cnt; i++) {
            reg_ctx->g_buf[i].hw_regs = mpp_calloc_size(void, sizeof(Vdpu382H265dRegSet));
            reg_ctx->offset_spspps[i] = SPSPPS_OFFSET(i);
            reg_ctx->offset_rps[i] = RPS_OFFSET(i);
            reg_ctx->offset_sclst[i] = SCALIST_OFFSET(i);
        }
    }

    if (!reg_ctx->fast_mode) {
        reg_ctx->hw_regs = reg_ctx->g_buf[0].hw_regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->rps_offset = reg_ctx->offset_rps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    ret = mpp_buffer_write(reg_ctx->bufs, 0, (void*)cabac_table, sizeof(cabac_table));
    if (ret) {
        mpp_err("h265d write cabac_table data failed\n");
        return ret;
    }

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu382_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

#ifdef dump
    fp = fopen("/data/hal.bin", "wb");
#endif
    (void) cfg;
    return MPP_OK;
}